

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O3

int xz_filter_close(archive_read_filter *self)

{
  void *__ptr;
  
  __ptr = self->data;
  lzma_end(__ptr);
  free(*(void **)((long)__ptr + 0x88));
  free(__ptr);
  return 0;
}

Assistant:

static int
xz_filter_close(struct archive_read_filter *self)
{
	struct private_data *state;

	state = (struct private_data *)self->data;
	lzma_end(&(state->stream));
	free(state->out_block);
	free(state);
	return (ARCHIVE_OK);
}